

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void * ym2203_init(void *param,UINT32 clock,UINT32 rate,FM_TIMERHANDLER timer_handler,
                  FM_IRQHANDLER IRQHandler)

{
  YM2203 *F2203;
  FM_IRQHANDLER IRQHandler_local;
  FM_TIMERHANDLER timer_handler_local;
  UINT32 rate_local;
  UINT32 clock_local;
  void *param_local;
  
  param_local = calloc(1,0x4b40);
  if (param_local == (void *)0x0) {
    param_local = (void *)0x0;
  }
  else {
    init_tables();
    *(void **)((long)param_local + 0x110) = param;
    *(undefined1 *)((long)param_local + 0x108) = 1;
    *(long *)((long)param_local + 0x5a0) = (long)param_local + 0x4678;
    *(UINT32 *)((long)param_local + 0x118) = clock;
    *(UINT32 *)((long)param_local + 0x11c) = rate;
    OPNCheckNativeSampleRate((FM_OPN *)((long)param_local + 0x108));
    *(FM_TIMERHANDLER *)((long)param_local + 0x548) = timer_handler;
    *(FM_IRQHANDLER *)((long)param_local + 0x550) = IRQHandler;
    OPNLinkSSG((FM_OPN *)((long)param_local + 0x108),(ssg_callbacks *)0x0,(void *)0x0);
    OPNSetSmplRateChgCallback
              ((FM_OPN *)((long)param_local + 0x108),(DEVCB_SRATE_CHG)0x0,(void *)0x0);
    ym2203_set_mute_mask(param_local,0);
  }
  return param_local;
}

Assistant:

void * ym2203_init(void *param, UINT32 clock, UINT32 rate,
				FM_TIMERHANDLER timer_handler,FM_IRQHANDLER IRQHandler)
{
	YM2203 *F2203;

	/* allocate ym2203 state space */
	F2203 = (YM2203 *)calloc(1,sizeof(YM2203));
	if( F2203==NULL)
		return NULL;

	/* allocate total level table (128kb space) */
	init_tables();

	F2203->OPN.ST.param = param;
	F2203->OPN.type = TYPE_YM2203;
	F2203->OPN.P_CH = F2203->CH;
	F2203->OPN.ST.clock = clock;
	F2203->OPN.ST.rate = rate;
	OPNCheckNativeSampleRate(&F2203->OPN);

	F2203->OPN.ST.timer_handler = timer_handler;
	F2203->OPN.ST.IRQ_Handler   = IRQHandler;
	OPNLinkSSG(&F2203->OPN, NULL, NULL);
	OPNSetSmplRateChgCallback(&F2203->OPN, NULL, NULL);

	ym2203_set_mute_mask(F2203, 0x00);

	return F2203;
}